

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Configlist_closure(lemon *lemp)

{
  int iVar1;
  rule *prVar2;
  symbol *psVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  config *pcVar7;
  config *pcVar8;
  ulong uVar9;
  plink *ppVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  rule *rp;
  
  pcVar7 = current;
  if (currentend == (config **)0x0) {
    __assert_fail("currentend!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                  ,0x4ed,"void Configlist_closure(struct lemon *)");
  }
  do {
    if (pcVar7 == (config *)0x0) {
      return;
    }
    prVar2 = pcVar7->rp;
    iVar1 = pcVar7->dot;
    if ((iVar1 < prVar2->nrhs) && (psVar3 = prVar2->rhs[iVar1], psVar3->type == NONTERMINAL)) {
      if ((psVar3->rule == (rule *)0x0) && (psVar3 != lemp->errsym)) {
        ErrorMsg(lemp->filename,prVar2->line,"Nonterminal \"%s\" has no rules.",psVar3->name);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
      for (rp = psVar3->rule; rp != (rule *)0x0; rp = rp->nextlhs) {
        pcVar8 = Configlist_add(rp,0);
        iVar6 = size;
        uVar9 = (ulong)(uint)size;
        lVar13 = (long)iVar1;
        do {
          lVar13 = lVar13 + 1;
          if (prVar2->nrhs <= lVar13) break;
          psVar3 = prVar2->rhs[lVar13];
          if (psVar3->type == TERMINAL) {
            SetAdd(pcVar8->fws,psVar3->index);
            break;
          }
          if (psVar3->type == MULTITERMINAL) {
            if (0 < psVar3->nsubsym) {
              lVar12 = 0;
              do {
                SetAdd(pcVar8->fws,psVar3->subsym[lVar12]->index);
                lVar12 = lVar12 + 1;
              } while (lVar12 < psVar3->nsubsym);
            }
            break;
          }
          if (0 < iVar6) {
            pcVar4 = pcVar8->fws;
            pcVar5 = psVar3->firstset;
            uVar11 = 0;
            do {
              if ((pcVar5[uVar11] != '\0') && (pcVar4[uVar11] == '\0')) {
                pcVar4[uVar11] = '\x01';
              }
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
        } while (psVar3->lambda != LEMON_FALSE);
        if (prVar2->nrhs == (int)lVar13) {
          ppVar10 = Plink_new();
          ppVar10->next = pcVar7->fplp;
          pcVar7->fplp = ppVar10;
          ppVar10->cfp = pcVar8;
        }
      }
    }
    pcVar7 = pcVar7->next;
  } while( true );
}

Assistant:

void Configlist_closure(struct lemon *lemp)
{
  struct config *cfp, *newcfp;
  struct rule *rp, *newrp;
  struct symbol *sp, *xsp;
  int i, dot;

  assert( currentend!=0 );
  for(cfp=current; cfp; cfp=cfp->next){
    rp = cfp->rp;
    dot = cfp->dot;
    if( dot>=rp->nrhs ) continue;
    sp = rp->rhs[dot];
    if( sp->type==NONTERMINAL ){
      if( sp->rule==0 && sp!=lemp->errsym ){
        ErrorMsg(lemp->filename,rp->line,"Nonterminal \"%s\" has no rules.",
          sp->name);
        lemp->errorcnt++;
      }
      for(newrp=sp->rule; newrp; newrp=newrp->nextlhs){
        newcfp = Configlist_add(newrp,0);
        for(i=dot+1; i<rp->nrhs; i++){
          xsp = rp->rhs[i];
          if( xsp->type==TERMINAL ){
            SetAdd(newcfp->fws,xsp->index);
            break;
          }else if( xsp->type==MULTITERMINAL ){
            int k;
            for(k=0; k<xsp->nsubsym; k++){
              SetAdd(newcfp->fws, xsp->subsym[k]->index);
            }
            break;
	  }else{
            SetUnion(newcfp->fws,xsp->firstset);
            if( xsp->lambda==LEMON_FALSE ) break;
	  }
	}
        if( i==rp->nrhs ) Plink_add(&cfp->fplp,newcfp);
      }
    }
  }
  return;
}